

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointSpecsOf.hpp
# Opt level: O1

string * __thiscall
sciplot::PointSpecsOf<sciplot::DrawSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,PointSpecsOf<sciplot::DrawSpecs> *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->m_pointtype)._M_dataplus._M_p,
                      (this->m_pointtype)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(this->m_pointsize)._M_dataplus._M_p,(this->m_pointsize)._M_string_length);
  std::__cxx11::stringbuf::str();
  internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

auto PointSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    std::stringstream ss; // ensure it remains empty if no point style option has been given!
    ss << m_pointtype << " ";
    ss << m_pointsize;
    return internal::removeExtraWhitespaces(ss.str());
}